

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::WireHelpers::disown
          (OrphanBuilder *__return_storage_ptr__,SegmentBuilder *segment,CapTableBuilder *capTable,
          WirePointer *ref)

{
  uint uVar1;
  WirePointer WVar2;
  WirePointer *pWVar3;
  uint *puVar4;
  
  uVar1 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef == (StructRef)0x0 && uVar1 == 0) {
    pWVar3 = (WirePointer *)0x0;
  }
  else if ((uVar1 & 3) == 3) {
    pWVar3 = (WirePointer *)0x1;
    if (uVar1 != 3) {
      disown();
    }
  }
  else if ((uVar1 & 3) == 2) {
    segment = BuilderArena::getSegment
                        ((BuilderArena *)(segment->super_SegmentReader).arena,
                         (SegmentId)(ref->field_1).structRef);
    uVar1 = (ref->offsetAndKind).value;
    puVar4 = (uint *)((long)&((segment->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar1 & 0xfffffff8));
    if ((uVar1 & 4) == 0) {
      pWVar3 = (WirePointer *)(puVar4 + (long)((int)*puVar4 >> 2) * 2 + 2);
    }
    else {
      segment = BuilderArena::getSegment
                          ((BuilderArena *)(segment->super_SegmentReader).arena,(SegmentId)puVar4[1]
                          );
      pWVar3 = (WirePointer *)
               ((long)&((segment->super_SegmentReader).ptr.ptr)->content +
               (ulong)(*puVar4 & 0xfffffff8));
    }
  }
  else {
    pWVar3 = ref + (long)((int)uVar1 >> 2) + 1;
  }
  __return_storage_ptr__->segment = segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = (word *)pWVar3;
  WVar2 = *ref;
  (__return_storage_ptr__->tag).content = (uint64_t)WVar2;
  if ((((ulong)WVar2 & 2) == 0) && (((ulong)WVar2 & 0xffffffff) != 0 || (ulong)WVar2 >> 0x20 != 0))
  {
    *(uint *)&(__return_storage_ptr__->tag).content = WVar2.offsetAndKind.value.value | 0xfffffffc;
  }
  ref->offsetAndKind = 0;
  ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  return __return_storage_ptr__;
}

Assistant:

static OrphanBuilder disown(SegmentBuilder* segment, CapTableBuilder* capTable,
                              WirePointer* ref) {
    word* location;

    if (ref->isNull()) {
      location = nullptr;
    } else if (ref->kind() == WirePointer::OTHER) {
      KJ_REQUIRE(ref->isCapability(), "Unknown pointer type.") { break; }
      location = reinterpret_cast<word*>(1);  // dummy so that it is non-null
    } else {
      WirePointer* refCopy = ref;
      location = followFarsNoWritableCheck(refCopy, ref->target(), segment);
    }

    OrphanBuilder result(ref, segment, capTable, location);

    if (!ref->isNull() && ref->isPositional()) {
      result.tagAsPtr()->setKindForOrphan(ref->kind());
    }

    // Zero out the pointer that was disowned.
    zeroMemory(ref);

    return result;
  }